

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::Clear(Cord *this)

{
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordRep *tree;
  Cord *this_local;
  
  rep = InlineRep::clear(&this->contents_);
  if (rep != (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    cord_internal::CordRep::Unref(rep);
  }
  return;
}

Assistant:

void Cord::Clear() {
  if (CordRep* tree = contents_.clear()) {
    CordRep::Unref(tree);
  }
}